

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImGuiNavLayer *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  if ((((uint)window->Flags >> 0x12 & 1) == 0) &&
     (((window->Flags & 0x5000000U) != 0x1000000 || (window->NavLastIds[0] == 0 || force_reinit))))
  {
    pIVar1 = &GImGui->NavLayer;
    GImGui->NavId = 0;
    pIVar2->NavWindow->NavLastIds[(int)*pIVar1] = 0;
    pIVar2->NavInitRequestFromMove = false;
    pIVar2->NavInitResultId = 0;
    (pIVar2->NavInitResultRectRel).Min.x = 3.4028235e+38;
    (pIVar2->NavInitResultRectRel).Min.y = 3.4028235e+38;
    (pIVar2->NavInitResultRectRel).Max.x = -3.4028235e+38;
    (pIVar2->NavInitResultRectRel).Max.y = -3.4028235e+38;
    pIVar2->NavAnyRequest = true;
    pIVar2->NavInitRequest = true;
    return;
  }
  GImGui->NavId = window->NavLastIds[0];
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);
    bool init_for_nav = false;
    if (!(window->Flags & ImGuiWindowFlags_NoNavInputs))
        if (!(window->Flags & ImGuiWindowFlags_ChildWindow) || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
            init_for_nav = true;
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer);
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResultId = 0;
        g.NavInitResultRectRel = ImRect();
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
    }
}